

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O3

void __thiscall result_tests::check_value_or::test_method(check_value_or *this)

{
  bilingual_str s;
  bilingual_str s_00;
  int iVar1;
  T *pTVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  undefined8 in_stack_fffffffffffffc48;
  char *pcVar5;
  undefined8 in_stack_fffffffffffffc50;
  char *pcVar6;
  undefined8 in_stack_fffffffffffffc58;
  undefined1 *puVar7;
  undefined8 in_stack_fffffffffffffc60;
  undefined1 *puVar8;
  undefined8 in_stack_fffffffffffffc68;
  char *pcVar9;
  undefined8 in_stack_fffffffffffffc70;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  assertion_result local_378;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined4 local_314;
  undefined1 local_310 [24];
  char *local_2f8 [2];
  undefined1 *local_2e8 [2];
  char *local_2d8;
  char *local_2d0;
  undefined4 local_2c4;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined4 *local_2a0;
  Result<result_tests::NoCopy> *local_298;
  char *local_290;
  char *local_288;
  long *local_280;
  long local_278;
  long local_270 [2];
  long *local_260;
  long local_258;
  long local_250 [2];
  long *local_240;
  long local_238;
  long local_230 [2];
  long *local_220 [2];
  long local_210 [2];
  long *local_200 [2];
  long local_1f0 [2];
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  lazy_ostream local_1c0;
  _func_int *local_1b0;
  char *local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  long *local_180;
  long local_178;
  long local_170 [2];
  undefined1 local_160 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  long *local_120;
  long local_118;
  long local_110 [2];
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Variadic_union<bilingual_str,_bilingual_str> local_80;
  char local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = &DAT_00000058;
  file.m_begin = (iterator)&local_2b0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2c0,msg);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1b0 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_80._0_4_ = 10;
  local_40 = '\x01';
  pTVar2 = util::Result<int>::value((Result<int> *)&local_80._M_first);
  local_310._0_4_ = *pTVar2;
  local_2a0 = &local_2c4;
  local_2c4 = 10;
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(*pTVar2 == 10);
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_288 = "";
  local_b0._8_8_ = &local_298;
  local_c0[8] = 0;
  local_c0._0_8_ = &PTR__lazy_ostream_013ae248;
  local_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_150._8_8_ = &local_2a0;
  local_160[8] = 0;
  local_160._0_8_ = &PTR__lazy_ostream_013ae248;
  local_150._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_298 = (Result<result_tests::NoCopy> *)local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_378,&local_1c0,1,2,REQUIRE,0xec543d,(size_t)&local_290,0x58,local_c0,"10",
             local_160);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_int>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_int> *)&local_80._M_first);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_2d0 = "";
  local_2e8[0] = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8[1] = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x59;
  file_00.m_begin = (iterator)&local_2d8;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)local_2e8,msg_00
            );
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1b0 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  IntFn((Result<int> *)&local_80._M_first,10,false);
  iVar1 = 0x14;
  if (local_40 == '\x01') {
    pTVar2 = util::Result<int>::value((Result<int> *)&local_80._M_first);
    iVar1 = *pTVar2;
  }
  local_310._0_4_ = iVar1;
  local_2c4 = 0x14;
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_288 = "";
  local_c0[8] = 0;
  local_c0._0_8_ = &PTR__lazy_ostream_013ae248;
  local_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b0._8_8_ = &local_298;
  local_2a0 = &local_2c4;
  local_160[8] = 0;
  local_160._0_8_ = &PTR__lazy_ostream_013ae248;
  local_150._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_150._8_8_ = &local_2a0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_298 = (Result<result_tests::NoCopy> *)local_310;
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar1 == 0x14);
  boost::test_tools::tt_detail::report_assertion
            (&local_378,&local_1c0,1,2,REQUIRE,0xec545a,(size_t)&local_290,0x59,local_c0,"20",
             local_160);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_int>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_int> *)&local_80._M_first);
  local_2f8[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_2f8[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp"
                         + 0x5e);
  local_310._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_310._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5a;
  file_01.m_begin = (iterator)local_2f8;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)(local_310 + 8),
             msg_01);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1b0 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_80._0_8_ = operator_new(4);
  *(undefined4 *)local_80._0_8_ = 10;
  local_40 = 1;
  local_2c4 = 0x14;
  util::Result<result_tests::NoCopy>::value_or<int>
            ((Result<result_tests::NoCopy> *)local_310,(int *)&local_80);
  local_314 = 10;
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(*(int *)local_310._0_8_ == 10);
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_288 = "";
  local_c0[8] = 0;
  local_c0._0_8_ = &PTR__lazy_ostream_013b0fc8;
  local_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b0._8_8_ = &local_298;
  local_160[8] = 0;
  local_160._0_8_ = &PTR__lazy_ostream_013ae248;
  local_150._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_150._8_8_ = &local_2a0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_2a0 = &local_314;
  local_298 = (Result<result_tests::NoCopy> *)local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_378,&local_1c0,1,2,REQUIRE,0xec5478,(size_t)&local_290,0x5a,local_c0,"10",
             local_160);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  if ((_Variadic_union<result_tests::NoCopy>)local_310._0_8_ !=
      (_Variadic_union<result_tests::NoCopy>)0x0) {
    operator_delete((void *)local_310._0_8_,4);
  }
  local_310._0_8_ = (_Variadic_union<result_tests::NoCopy>)0x0;
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_result_tests::NoCopy>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_result_tests::NoCopy> *)
                    &local_80._M_first);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5b;
  file_02.m_begin = (iterator)&local_328;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_338,
             msg_02);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1b0 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  NoCopyFn((Result<result_tests::NoCopy> *)&local_80._M_first,10,false);
  local_2c4 = 0x14;
  util::Result<result_tests::NoCopy>::value_or<int>
            ((Result<result_tests::NoCopy> *)local_310,(int *)&local_80);
  local_314 = 0x14;
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(*(int *)local_310._0_8_ == 0x14);
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_288 = "";
  local_c0[8] = 0;
  local_c0._0_8_ = &PTR__lazy_ostream_013b0fc8;
  local_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b0._8_8_ = &local_298;
  local_160[8] = 0;
  local_160._0_8_ = &PTR__lazy_ostream_013ae248;
  local_150._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_150._8_8_ = &local_2a0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_2a0 = &local_314;
  local_298 = (Result<result_tests::NoCopy> *)local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_378,&local_1c0,1,2,REQUIRE,0xec5498,(size_t)&local_290,0x5b,local_c0,"20",
             local_160);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  if ((_Variadic_union<result_tests::NoCopy>)local_310._0_8_ !=
      (_Variadic_union<result_tests::NoCopy>)0x0) {
    operator_delete((void *)local_310._0_8_,4);
  }
  local_310._0_8_ = (_Variadic_union<result_tests::NoCopy>)0x0;
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_result_tests::NoCopy>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_result_tests::NoCopy> *)
                    &local_80._M_first);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x5c;
  file_03.m_begin = (iterator)&local_348;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_358,
             msg_03);
  local_378.m_message.px = (element_type *)((ulong)local_378.m_message.px & 0xffffffffffffff00);
  local_378._0_8_ = &PTR__lazy_ostream_013ae088;
  local_378.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_360 = "";
  pcVar11 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  pcVar12 = "";
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"A","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_100,local_120,local_118 + (long)local_120);
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,local_120,local_118 + (long)local_120);
  s.original._M_string_length = in_stack_fffffffffffffc50;
  s.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc48;
  s.original.field_2._M_allocated_capacity = in_stack_fffffffffffffc58;
  s.original.field_2._8_8_ = in_stack_fffffffffffffc60;
  s.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc68;
  s.translated._M_string_length = in_stack_fffffffffffffc70;
  s.translated.field_2._M_allocated_capacity = (size_type)pcVar11;
  s.translated.field_2._8_8_ = pcVar12;
  StrFn((Result<bilingual_str> *)&local_80._M_first,s,false);
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"B","");
  local_160._0_8_ = &local_150;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_160,local_180,local_178 + (long)local_180);
  local_140._M_p = (pointer)&local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_180,local_178 + (long)local_180);
  util::Result<bilingual_str>::value_or<bilingual_str>
            ((T *)local_c0,(Result<bilingual_str> *)&local_80._M_first,(bilingual_str *)local_160);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"A","");
  local_1c0._vptr_lazy_ostream = &local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_1e0,local_1d8 + (long)local_1e0);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,local_1e0,local_1d8 + (long)local_1e0);
  pvVar3 = local_c0;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
            (&local_378,&stack0xfffffffffffffc78,0x5c,1,2,pvVar3,
             "StrFn(Untranslated(\"A\"), true).value_or(Untranslated(\"B\"))",&local_1c0,
             "Untranslated(\"A\")");
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_1c0._vptr_lazy_ostream != &local_1b0) {
    operator_delete(local_1c0._vptr_lazy_ostream,(ulong)(local_1b0 + 1));
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._0_8_ != &local_b0) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_b0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_p != &local_130) {
    operator_delete(local_140._M_p,local_130._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ != &local_150) {
    operator_delete((void *)local_160._0_8_,(ulong)(local_150._M_allocated_capacity + 1));
  }
  if (local_180 != local_170) {
    operator_delete(local_180,local_170[0] + 1);
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_bilingual_str>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_bilingual_str> *)&local_80._M_first);
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  pcVar9 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  pcVar10 = "";
  puVar7 = &boost::unit_test::basic_cstring<char_const>::null;
  puVar8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5d;
  file_04.m_begin = &stack0xfffffffffffffc68;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
             (size_t)&stack0xfffffffffffffc58,msg_04);
  local_378.m_message.px = (element_type *)((ulong)local_378.m_message.px & 0xffffffffffffff00);
  local_378._0_8_ = &PTR__lazy_ostream_013ae088;
  local_378.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_360 = "";
  pcVar5 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  pcVar6 = "";
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"A","");
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,local_240,local_238 + (long)local_240);
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_200,local_240,local_238 + (long)local_240);
  s_00.original._M_string_length = (size_type)pcVar6;
  s_00.original._M_dataplus._M_p = pcVar5;
  s_00.original.field_2._M_allocated_capacity = (size_type)puVar7;
  s_00.original.field_2._8_8_ = puVar8;
  s_00.translated._M_dataplus._M_p = pcVar9;
  s_00.translated._M_string_length = (size_type)pcVar10;
  s_00.translated.field_2._M_allocated_capacity = (size_type)pcVar11;
  s_00.translated.field_2._8_8_ = pcVar12;
  StrFn((Result<bilingual_str> *)&local_80._M_first,s_00,SUB81(local_220,0));
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"B","");
  local_160._0_8_ = &local_150;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_160,local_260,local_258 + (long)local_260);
  local_140._M_p = (pointer)&local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_260,local_258 + (long)local_260);
  util::Result<bilingual_str>::value_or<bilingual_str>
            ((T *)local_c0,(Result<bilingual_str> *)&local_80._M_first,(bilingual_str *)local_160);
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"B","");
  local_1c0._vptr_lazy_ostream = &local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_280,local_278 + (long)local_280);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,local_280,local_278 + (long)local_280);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
            (&local_378,&stack0xfffffffffffffc48,0x5d,1,2,local_c0,
             "StrFn(Untranslated(\"A\"), false).value_or(Untranslated(\"B\"))",&local_1c0,
             "Untranslated(\"B\")");
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_1c0._vptr_lazy_ostream != &local_1b0) {
    operator_delete(local_1c0._vptr_lazy_ostream,(ulong)(local_1b0 + 1));
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._0_8_ != &local_b0) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_b0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_p != &local_130) {
    operator_delete(local_140._M_p,local_130._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ != &local_150) {
    operator_delete((void *)local_160._0_8_,(ulong)(local_150._M_allocated_capacity + 1));
  }
  if (local_260 != local_250) {
    operator_delete(local_260,local_250[0] + 1);
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_bilingual_str>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_bilingual_str> *)&local_80._M_first);
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0],local_1f0[0] + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_value_or)
{
    BOOST_CHECK_EQUAL(IntFn(10, true).value_or(20), 10);
    BOOST_CHECK_EQUAL(IntFn(10, false).value_or(20), 20);
    BOOST_CHECK_EQUAL(NoCopyFn(10, true).value_or(20), 10);
    BOOST_CHECK_EQUAL(NoCopyFn(10, false).value_or(20), 20);
    BOOST_CHECK_EQUAL(StrFn(Untranslated("A"), true).value_or(Untranslated("B")), Untranslated("A"));
    BOOST_CHECK_EQUAL(StrFn(Untranslated("A"), false).value_or(Untranslated("B")), Untranslated("B"));
}